

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O3

stref idx2::GetParentPath(stref *Path)

{
  anon_union_8_2_2df48d06_for_stref_0 aVar1;
  stref sVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  stref sVar6;
  
  aVar1 = (anon_union_8_2_2df48d06_for_stref_0)(Path->field_0).Ptr;
  lVar4 = (long)Path->Size;
  sVar2._8_8_ = lVar4;
  sVar2.field_0.Ptr = aVar1.Ptr;
  sVar6._8_8_ = lVar4;
  sVar6.field_0.Ptr = aVar1.Ptr;
  lVar3 = lVar4 + -1;
  if (lVar4 == 0) {
LAB_0019cb8e:
    sVar6 = sVar2;
    if (lVar3 != -1) {
      sVar6 = SubString(Path,0,(int)lVar3);
    }
  }
  else {
    do {
      if (aVar1.Ptr[lVar3] == '/') goto LAB_0019cb8e;
      bVar5 = lVar3 != 0;
      lVar3 = lVar3 + -1;
    } while (bVar5);
  }
  return sVar6;
}

Assistant:

stref
GetParentPath(const stref& Path)
{
  idx2_Assert(!Contains(Path, '\\'));
  cstr LastSlash = FindLast(RevBegin(Path), RevEnd(Path), '/');
  if (LastSlash != RevEnd(Path))
    return SubString(Path, 0, int(LastSlash - Begin(Path)));

  return Path;
}